

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_btGetAllMatches_extDict_6
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  BYTE *pBVar1;
  uint uVar2;
  U32 UVar3;
  uint uVar4;
  uint uVar5;
  U32 UVar6;
  int iVar7;
  size_t sVar8;
  U32 *pUVar9;
  bool bVar10;
  BYTE *local_358;
  BYTE *local_340;
  BYTE *local_328;
  uint local_318;
  uint local_314;
  uint local_310;
  uint local_304;
  uint local_300;
  uint local_2fc;
  BYTE *local_2f8;
  BYTE *local_2f0;
  ZSTD_matchState_t *local_2e0;
  U32 local_2d8;
  U32 local_2d4;
  uint local_2c8;
  uint local_2c4;
  uint local_2c0;
  uint local_2bc;
  U32 *rep_local;
  BYTE *iHighLimit_local;
  BYTE *ip_local;
  U32 *nextToUpdate3_local;
  ZSTD_matchState_t *ms_local;
  ZSTD_match_t *matches_local;
  uint local_240;
  U32 forward;
  U32 idx;
  U32 target;
  BYTE *base;
  BYTE *local_210;
  BYTE *match_3;
  size_t matchLength_1;
  U32 *nextPtr_1;
  U32 *dmsBt;
  U32 dictMatchIndex;
  size_t dmsH;
  size_t matchLength;
  BYTE *match_2;
  U32 *nextPtr;
  BYTE *match_1;
  BYTE *match;
  size_t mlen;
  U32 matchIndex3;
  BYTE *repMatch;
  U32 repLen;
  U32 repIndex;
  U32 repOffset;
  U32 repCode;
  U32 lastR;
  size_t bestLength;
  U32 dmsBtLow;
  U32 dmsBtMask;
  U32 dmsBtLog;
  U32 dmsHashLog;
  U32 dmsIndexDelta;
  U32 dmsLowLimit;
  U32 dmsHighLimit;
  BYTE *dmsEnd;
  BYTE *dmsBase;
  ZSTD_compressionParameters *dmsCParams;
  ZSTD_matchState_t *dms;
  U32 nbCompares;
  U32 mnum;
  U32 dummy32;
  U32 matchEndIdx;
  U32 *largerPtr;
  U32 *smallerPtr;
  U32 local_118;
  U32 matchLow;
  U32 windowLow;
  U32 btLow;
  BYTE *prefixStart;
  BYTE *dictEnd;
  BYTE *pBStack_f8;
  U32 dictLimit;
  BYTE *dictBase;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  size_t sStack_c8;
  U32 matchIndex;
  size_t h;
  U32 *hashTable;
  uint local_b0;
  U32 minMatch;
  U32 hashLog;
  U32 curr;
  BYTE *base_1;
  ZSTD_compressionParameters *pZStack_98;
  U32 sufficient_len;
  ZSTD_compressionParameters *cParams;
  U32 local_88;
  U32 local_84;
  U32 *local_80;
  int local_74;
  BYTE *local_70;
  BYTE *local_68;
  U32 *local_60;
  ZSTD_matchState_t *local_58;
  ZSTD_match_t *local_50;
  uint local_40;
  uint local_3c;
  BYTE *local_38;
  size_t local_30;
  undefined4 local_28;
  uint local_24;
  BYTE *local_20;
  size_t local_18;
  
  if ((ms->cParams).minMatch < 6) {
    local_2bc = (ms->cParams).minMatch;
  }
  else {
    local_2bc = 6;
  }
  if (local_2bc < 3) {
    local_2c0 = 3;
  }
  else {
    if ((ms->cParams).minMatch < 6) {
      local_2c4 = (ms->cParams).minMatch;
    }
    else {
      local_2c4 = 6;
    }
    local_2c0 = local_2c4;
  }
  if (local_2c0 != 6) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x33f,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  if (ip < (ms->window).base + ms->nextToUpdate) {
    return 0;
  }
  pBVar1 = (ms->window).base;
  uVar2 = (int)ip - (int)pBVar1;
  for (local_240 = ms->nextToUpdate; local_240 < uVar2; local_240 = UVar3 + local_240) {
    UVar3 = ZSTD_insertBt1(ms,pBVar1 + local_240,iHighLimit,uVar2,6,1);
    if (local_240 + UVar3 <= local_240) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x236,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if (0xffffffff < (ulong)((long)ip - (long)pBVar1)) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x239,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (0xffffffff < (ulong)((long)iHighLimit - (long)pBVar1)) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x23a,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar2;
  local_74 = 1;
  local_84 = ll0;
  local_88 = lengthToBeat;
  cParams._4_4_ = 6;
  pZStack_98 = &ms->cParams;
  if ((ms->cParams).targetLength < 0xfff) {
    local_2c8 = (ms->cParams).targetLength;
  }
  else {
    local_2c8 = 0xfff;
  }
  base_1._4_4_ = local_2c8;
  _hashLog = (ms->window).base;
  minMatch = (int)ip - (int)_hashLog;
  local_b0 = (ms->cParams).hashLog;
  hashTable._4_4_ = 4;
  h = (size_t)ms->hashTable;
  local_28 = 6;
  local_80 = rep;
  local_70 = iHighLimit;
  local_68 = ip;
  local_60 = nextToUpdate3;
  local_58 = ms;
  local_50 = matches;
  local_24 = local_b0;
  local_20 = ip;
  if (0x20 < local_b0) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  switch(0x3f857c) {
  case 0:
    local_18 = ZSTD_hash4Ptr(ip,local_b0);
    break;
  case 1:
    local_18 = ZSTD_hash5Ptr(ip,local_b0);
    break;
  case 2:
    local_18 = ZSTD_hash6Ptr(ip,local_b0);
    break;
  case 3:
    local_18 = ZSTD_hash7Ptr(ip,local_b0);
    break;
  case 4:
    local_18 = ZSTD_hash8Ptr(ip,local_b0);
  }
  sStack_c8 = local_18;
  bt._4_4_ = *(uint *)(h + local_18 * 4);
  _btMask = local_58->chainTable;
  commonLengthSmaller._4_4_ = pZStack_98->chainLog - 1;
  commonLengthSmaller._0_4_ = (1 << ((byte)commonLengthSmaller._4_4_ & 0x1f)) - 1;
  commonLengthLarger = 0;
  dictBase = (BYTE *)0x0;
  pBStack_f8 = (local_58->window).dictBase;
  dictEnd._4_4_ = (local_58->window).dictLimit;
  prefixStart = pBStack_f8 + dictEnd._4_4_;
  _windowLow = _hashLog + dictEnd._4_4_;
  if ((uint)commonLengthSmaller < minMatch) {
    local_2d4 = minMatch - (uint)commonLengthSmaller;
  }
  else {
    local_2d4 = 0;
  }
  matchLow = local_2d4;
  local_118 = ZSTD_getLowestMatchIndex(local_58,minMatch,pZStack_98->windowLog);
  local_2d8 = local_118;
  if (local_118 == 0) {
    local_2d8 = 1;
  }
  smallerPtr._4_4_ = local_2d8;
  largerPtr = _btMask + ((minMatch & (uint)commonLengthSmaller) << 1);
  _dummy32 = _btMask + (ulong)((minMatch & (uint)commonLengthSmaller) << 1) + 1;
  mnum = minMatch + 9;
  dms._4_4_ = 0;
  dms._0_4_ = 1 << ((byte)pZStack_98->searchLog & 0x1f);
  if (local_74 == 2) {
    local_2e0 = local_58->dictMatchState;
    local_2f0 = (local_2e0->window).base;
    local_2f8 = (local_2e0->window).nextSrc;
    local_2fc = (int)local_2f8 - (int)local_2f0;
    local_300 = (local_2e0->window).lowLimit;
    local_304 = local_118 - local_2fc;
    uVar2 = (local_2e0->cParams).hashLog;
    local_310 = (1 << ((char)(local_2e0->cParams).chainLog - 1U & 0x1f)) - 1;
    local_314 = local_300;
    if (local_310 < local_2fc - local_300) {
      local_314 = local_2fc - local_310;
    }
  }
  else {
    local_2e0 = (ZSTD_matchState_t *)0x0;
    local_2f0 = (BYTE *)0x0;
    local_2f8 = (BYTE *)0x0;
    local_2fc = 0;
    local_300 = 0;
    local_304 = 0;
    local_310 = 0;
    local_314 = local_300;
    uVar2 = local_b0;
  }
  _repCode = (BYTE *)(ulong)(local_88 - 1);
  if (1 < local_84) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x27a,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  uVar4 = local_84 + 3;
  for (repIndex = local_84; repIndex < uVar4; repIndex = repIndex + 1) {
    if (repIndex == 3) {
      local_318 = *local_80 - 1;
    }
    else {
      local_318 = local_80[repIndex];
    }
    uVar5 = minMatch - local_318;
    repMatch._4_4_ = 0;
    if (minMatch < dictEnd._4_4_) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x281,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (local_318 - 1 < minMatch - dictEnd._4_4_) {
      bVar10 = local_118 <= uVar5;
      UVar3 = ZSTD_readMINMATCH(local_68,hashTable._4_4_);
      UVar6 = ZSTD_readMINMATCH(local_68 + -(ulong)local_318,hashTable._4_4_);
      if (bVar10 && UVar3 == UVar6) {
        sVar8 = ZSTD_count(local_68 + hashTable._4_4_,
                           local_68 + ((ulong)hashTable._4_4_ - (ulong)local_318),local_70);
        repMatch._4_4_ = (int)sVar8 + hashTable._4_4_;
      }
    }
    else {
      if (local_74 == 2) {
        local_328 = local_2f0 + ((ulong)uVar5 - (ulong)local_304);
      }
      else {
        local_328 = pBStack_f8 + uVar5;
      }
      if (minMatch < local_118) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x28d,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if ((local_74 == 1) &&
         (local_318 - 1 < minMatch - local_118 && 2 < (dictEnd._4_4_ - 1) - uVar5)) {
        UVar3 = ZSTD_readMINMATCH(local_68,hashTable._4_4_);
        UVar6 = ZSTD_readMINMATCH(local_328,hashTable._4_4_);
        if (UVar3 == UVar6) {
          sVar8 = ZSTD_count_2segments
                            (local_68 + hashTable._4_4_,local_328 + hashTable._4_4_,local_70,
                             prefixStart,_windowLow);
          repMatch._4_4_ = (int)sVar8 + hashTable._4_4_;
        }
      }
      if ((local_74 == 2) &&
         (local_318 - 1 < minMatch - (local_300 + local_304) && 2 < (dictEnd._4_4_ - 1) - uVar5)) {
        UVar3 = ZSTD_readMINMATCH(local_68,hashTable._4_4_);
        UVar6 = ZSTD_readMINMATCH(local_328,hashTable._4_4_);
        if (UVar3 == UVar6) {
          sVar8 = ZSTD_count_2segments
                            (local_68 + hashTable._4_4_,local_328 + hashTable._4_4_,local_70,
                             local_2f8,_windowLow);
          repMatch._4_4_ = (int)sVar8 + hashTable._4_4_;
        }
      }
    }
    if (_repCode < (BYTE *)(ulong)repMatch._4_4_) {
      _repCode = (BYTE *)(ulong)repMatch._4_4_;
      if (repIndex - local_84 == -1) {
        __assert_fail("(repCode - ll0 + 1)>=1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x29f,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (3 < (repIndex - local_84) + 1) {
        __assert_fail("(repCode - ll0 + 1)<=ZSTD_REP_NUM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x29f,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      local_50[dms._4_4_].off = (repIndex - local_84) + 1;
      local_50[dms._4_4_].len = repMatch._4_4_;
      dms._4_4_ = dms._4_4_ + 1;
      if (base_1._4_4_ < repMatch._4_4_ || local_68 + repMatch._4_4_ == local_70) {
        return dms._4_4_;
      }
    }
  }
  if (((cParams._4_4_ == 3) && (_repCode < (BYTE *)0x3)) &&
     (UVar3 = ZSTD_insertAndFindFirstIndexHash3(local_58,local_60,local_68),
     smallerPtr._4_4_ <= UVar3 && minMatch - UVar3 < 0x40000)) {
    if (((local_74 == 0) || (local_74 == 2)) || (dictEnd._4_4_ <= UVar3)) {
      match = (BYTE *)ZSTD_count(local_68,_hashLog + UVar3,local_70);
    }
    else {
      match = (BYTE *)ZSTD_count_2segments
                                (local_68,pBStack_f8 + UVar3,local_70,prefixStart,_windowLow);
    }
    if ((BYTE *)(ulong)cParams._4_4_ <= match) {
      _repCode = match;
      if (minMatch <= UVar3) {
        __assert_fail("curr > matchIndex3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2ba,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (dms._4_4_ != 0) {
        __assert_fail("mnum==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,699,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (minMatch == UVar3) {
        __assert_fail("(curr - matchIndex3)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,700,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      local_50->off = (minMatch - UVar3) + 3;
      local_50->len = (U32)match;
      dms._4_4_ = 1;
      if ((BYTE *)(ulong)base_1._4_4_ < match || local_68 + (long)match == local_70) {
        local_58->nextToUpdate = minMatch + 1;
        return 1;
      }
    }
  }
  *(U32 *)(h + sStack_c8 * 4) = minMatch;
  for (; (uint)dms != 0 && smallerPtr._4_4_ <= bt._4_4_; dms._0_4_ = (uint)dms - 1) {
    pUVar9 = _btMask + ((bt._4_4_ & (uint)commonLengthSmaller) << 1);
    if (commonLengthLarger < dictBase) {
      local_340 = (BYTE *)commonLengthLarger;
    }
    else {
      local_340 = dictBase;
    }
    if (minMatch <= bt._4_4_) {
      __assert_fail("curr > matchIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x2cd,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (((local_74 == 0) || (local_74 == 2)) ||
       ((BYTE *)(ulong)dictEnd._4_4_ <= local_340 + bt._4_4_)) {
      if (local_340 + bt._4_4_ < (BYTE *)(ulong)dictEnd._4_4_) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2d0,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      matchLength = (size_t)(_hashLog + bt._4_4_);
      if ((dictEnd._4_4_ <= bt._4_4_) &&
         (iVar7 = memcmp((void *)matchLength,local_68,(size_t)local_340), iVar7 != 0)) {
        __assert_fail("memcmp(match, ip, matchLength) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2d2,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      sVar8 = ZSTD_count(local_68 + (long)local_340,(BYTE *)(matchLength + (long)local_340),local_70
                        );
      dmsH = (size_t)(local_340 + sVar8);
    }
    else {
      matchLength = (size_t)(pBStack_f8 + bt._4_4_);
      iVar7 = memcmp((void *)matchLength,local_68,(size_t)local_340);
      if (iVar7 != 0) {
        __assert_fail("memcmp(match, ip, matchLength) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2d6,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      sVar8 = ZSTD_count_2segments
                        (local_68 + (long)local_340,(BYTE *)(matchLength + (long)local_340),local_70
                         ,prefixStart,_windowLow);
      dmsH = (size_t)(local_340 + sVar8);
      if ((BYTE *)(ulong)dictEnd._4_4_ <= (BYTE *)(dmsH + bt._4_4_)) {
        matchLength = (size_t)(_hashLog + bt._4_4_);
      }
    }
    if (_repCode < dmsH) {
      if (mnum <= bt._4_4_) {
        __assert_fail("matchEndIdx > matchIndex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2df,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (mnum - bt._4_4_ < dmsH) {
        mnum = bt._4_4_ + (U32)dmsH;
      }
      _repCode = (BYTE *)dmsH;
      if (minMatch == bt._4_4_) {
        __assert_fail("(curr - matchIndex)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2e3,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      local_50[dms._4_4_].off = (minMatch - bt._4_4_) + 3;
      local_50[dms._4_4_].len = (U32)dmsH;
      dms._4_4_ = dms._4_4_ + 1;
      if (0x1000 < dmsH || local_68 + dmsH == local_70) {
        if (local_74 == 2) {
          dms._0_4_ = 0;
        }
        break;
      }
    }
    if (*(byte *)(matchLength + dmsH) < local_68[dmsH]) {
      *largerPtr = bt._4_4_;
      commonLengthLarger = dmsH;
      if (bt._4_4_ <= matchLow) {
        largerPtr = &nbCompares;
        break;
      }
      largerPtr = pUVar9 + 1;
      bt._4_4_ = pUVar9[1];
    }
    else {
      *_dummy32 = bt._4_4_;
      dictBase = (BYTE *)dmsH;
      if (bt._4_4_ <= matchLow) {
        _dummy32 = &nbCompares;
        break;
      }
      bt._4_4_ = *pUVar9;
      _dummy32 = pUVar9;
    }
  }
  *_dummy32 = 0;
  *largerPtr = 0;
  if (0x40000000 < (uint)dms) {
    __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x2fd,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  if ((local_74 == 2) && ((uint)dms != 0)) {
    local_38 = local_68;
    local_40 = cParams._4_4_;
    local_3c = uVar2;
    if (0x20 < uVar2) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    switch(cParams._4_4_) {
    default:
      local_30 = ZSTD_hash4Ptr(local_68,uVar2);
      break;
    case 5:
      local_30 = ZSTD_hash5Ptr(local_68,uVar2);
      break;
    case 6:
      local_30 = ZSTD_hash6Ptr(local_68,uVar2);
      break;
    case 7:
      local_30 = ZSTD_hash7Ptr(local_68,uVar2);
      break;
    case 8:
      local_30 = ZSTD_hash8Ptr(local_68,uVar2);
    }
    dmsBt._4_4_ = local_2e0->hashTable[local_30];
    pUVar9 = local_2e0->chainTable;
    dictBase = (BYTE *)0x0;
    commonLengthLarger = 0;
    for (; (uint)dms != 0 && local_300 < dmsBt._4_4_; dms._0_4_ = (uint)dms - 1) {
      if (commonLengthLarger < dictBase) {
        local_358 = (BYTE *)commonLengthLarger;
      }
      else {
        local_358 = dictBase;
      }
      local_210 = local_2f0 + dmsBt._4_4_;
      sVar8 = ZSTD_count_2segments
                        (local_68 + (long)local_358,local_210 + (long)local_358,local_70,local_2f8,
                         _windowLow);
      local_358 = local_358 + sVar8;
      if ((BYTE *)(ulong)local_2fc <= local_358 + dmsBt._4_4_) {
        local_210 = _hashLog + (ulong)local_304 + (ulong)dmsBt._4_4_;
      }
      if (_repCode < local_358) {
        bt._4_4_ = dmsBt._4_4_ + local_304;
        if ((BYTE *)(ulong)(mnum - bt._4_4_) < local_358) {
          mnum = bt._4_4_ + (U32)local_358;
        }
        if (minMatch == bt._4_4_) {
          __assert_fail("(curr - matchIndex)>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x312,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        local_50[dms._4_4_].off = (minMatch - bt._4_4_) + 3;
        local_50[dms._4_4_].len = (U32)local_358;
        dms._4_4_ = dms._4_4_ + 1;
        _repCode = local_358;
        if ((BYTE *)0x1000 < local_358 || local_68 + (long)local_358 == local_70) break;
      }
      if (dmsBt._4_4_ <= local_314) break;
      if (local_210[(long)local_358] < local_68[(long)local_358]) {
        dmsBt._4_4_ = (pUVar9 + ((dmsBt._4_4_ & local_310) << 1))[1];
        commonLengthLarger = (size_t)local_358;
      }
      else {
        dmsBt._4_4_ = pUVar9[(dmsBt._4_4_ & local_310) << 1];
        dictBase = local_358;
      }
    }
  }
  if (minMatch + 8 < mnum) {
    local_58->nextToUpdate = mnum - 8;
    return dms._4_4_;
  }
  __assert_fail("matchEndIdx > curr+8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                ,0x324,
                "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
               );
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}